

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-homedir.c
# Opt level: O1

int run_test_homedir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  size_t sVar2;
  size_t extraout_RAX;
  uv_loop_t *puVar3;
  uint64_t uVar4;
  uv_loop_t *puVar5;
  char *unaff_RBX;
  uint uVar6;
  uv_timer_t *puVar7;
  long *plVar8;
  int64_t eval_b;
  int64_t eval_a;
  size_t len;
  char homedir [4096];
  long lStack_10b8;
  uv_loop_t *puStack_10b0;
  code *pcStack_10a8;
  code *pcStack_10a0;
  code *pcStack_1098;
  void *pvStack_1090;
  void *pvStack_1088;
  uv_loop_t *puStack_1080;
  uv__queue *puStack_1070;
  uv__queue *puStack_1068;
  undefined1 auStack_1060 [8];
  uv_handle_t *puStack_1058;
  uv_timer_cb p_Stack_1048;
  undefined8 uStack_1040;
  undefined8 uStack_1038;
  undefined8 local_1010;
  char local_1008 [4096];
  
  local_1010 = 0x1000;
  local_1008[0] = '\0';
  sVar2 = strlen(local_1008);
  if (sVar2 == 0) {
    iVar1 = uv_os_homedir(local_1008,&local_1010);
    if (iVar1 != 0) goto LAB_0019bf83;
    unaff_RBX = local_1008;
    sVar2 = strlen(unaff_RBX);
    if (sVar2 != local_1010) goto LAB_0019bf92;
    if ((long)local_1010 < 1) goto LAB_0019bfa1;
    if (local_1008[local_1010] != '\0') goto LAB_0019bfb0;
    sVar2 = local_1010;
    if (local_1010 == 1) {
      if (local_1008[0] != '/') {
        run_test_homedir_cold_7();
        sVar2 = extraout_RAX;
        goto LAB_0019be5e;
      }
LAB_0019be82:
      local_1010 = 1;
      iVar1 = uv_os_homedir(local_1008,&local_1010);
      if (iVar1 != -0x69) goto LAB_0019bfbf;
      if ((long)local_1010 < 2) goto LAB_0019bfce;
      iVar1 = uv_os_homedir((char *)0x0,&local_1010);
      if (iVar1 != -0x16) goto LAB_0019bfdd;
      iVar1 = uv_os_homedir(local_1008,(size_t *)0x0);
      if (iVar1 != -0x16) goto LAB_0019bfec;
      local_1010 = 0;
      iVar1 = uv_os_homedir(local_1008,&local_1010);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_0019bffb;
    }
LAB_0019be5e:
    if (unaff_RBX[sVar2 - 1] != '/') goto LAB_0019be82;
  }
  else {
    run_test_homedir_cold_1();
LAB_0019bf83:
    run_test_homedir_cold_2();
LAB_0019bf92:
    run_test_homedir_cold_3();
LAB_0019bfa1:
    run_test_homedir_cold_4();
LAB_0019bfb0:
    run_test_homedir_cold_5();
LAB_0019bfbf:
    run_test_homedir_cold_8();
LAB_0019bfce:
    run_test_homedir_cold_9();
LAB_0019bfdd:
    run_test_homedir_cold_10();
LAB_0019bfec:
    run_test_homedir_cold_11();
LAB_0019bffb:
    run_test_homedir_cold_12();
  }
  run_test_homedir_cold_6();
  uVar6 = 0x4c;
  uStack_1038 = unaff_RBX;
  while( true ) {
    puStack_1058 = (uv_handle_t *)0x19c02c;
    puVar3 = (uv_loop_t *)uv_hrtime();
    puStack_1058 = (uv_handle_t *)0x19c039;
    uv_sleep(0x2d);
    puStack_1058 = (uv_handle_t *)0x19c03e;
    uVar4 = uv_hrtime();
    uStack_1040 = uVar4 - (long)puVar3;
    p_Stack_1048 = (uv_timer_cb)0x17d7840;
    if ((ulong)uStack_1040 < (void *)0x17d7841) break;
    uVar6 = uVar6 - 1;
    if (uVar6 < 2) {
      return 0;
    }
  }
  puStack_1058 = (uv_handle_t *)run_test_clock_gettime;
  run_test_hrtime_cold_1();
  puStack_1068 = (uv__queue *)0xffffffffffffffea;
  puStack_1080 = (uv_loop_t *)0x19c096;
  iVar1 = uv_clock_gettime(0x539,(uv_timespec_t *)auStack_1060);
  puStack_1070 = (uv__queue *)(long)iVar1;
  if (puStack_1068 == puStack_1070) {
    puStack_1068 = (uv__queue *)0xfffffffffffffff2;
    puStack_1080 = (uv_loop_t *)0x19c0c2;
    iVar1 = uv_clock_gettime(0x539,(uv_timespec_t *)0x0);
    puStack_1070 = (uv__queue *)(long)iVar1;
    if (puStack_1068 != puStack_1070) goto LAB_0019c167;
    puStack_1080 = (uv_loop_t *)0x19c0e5;
    iVar1 = uv_clock_gettime(UV_CLOCK_MONOTONIC,(uv_timespec_t *)auStack_1060);
    puStack_1068 = (uv__queue *)(long)iVar1;
    puStack_1070 = (uv__queue *)0x0;
    if (puStack_1068 != (uv__queue *)0x0) goto LAB_0019c176;
    puStack_1080 = (uv_loop_t *)0x19c110;
    iVar1 = uv_clock_gettime(UV_CLOCK_REALTIME,(uv_timespec_t *)auStack_1060);
    puStack_1068 = (uv__queue *)(long)iVar1;
    puStack_1070 = (uv__queue *)0x0;
    if (puStack_1068 != (uv__queue *)0x0) goto LAB_0019c185;
    puStack_1068 = (uv__queue *)0x187bcd09900;
    puStack_1070 = (uv__queue *)auStack_1060;
    if ((long)auStack_1060 < 0x187bcd09900) {
      return 0;
    }
  }
  else {
    puStack_1080 = (uv_loop_t *)0x19c167;
    run_test_clock_gettime_cold_1();
LAB_0019c167:
    puStack_1080 = (uv_loop_t *)0x19c176;
    run_test_clock_gettime_cold_2();
LAB_0019c176:
    puStack_1080 = (uv_loop_t *)0x19c185;
    run_test_clock_gettime_cold_3();
LAB_0019c185:
    puStack_1080 = (uv_loop_t *)0x19c194;
    run_test_clock_gettime_cold_4();
  }
  puStack_1080 = (uv_loop_t *)0x19c1a3;
  run_test_clock_gettime_cold_5();
  pcStack_1098 = (code *)0x19c1ae;
  puStack_1080 = puVar3;
  puVar5 = uv_default_loop();
  pcStack_1098 = (code *)0x19c1bd;
  iVar1 = uv_idle_init(puVar5,&idle_handle);
  pvStack_1088 = (void *)(long)iVar1;
  pvStack_1090 = (void *)0x0;
  if (pvStack_1088 == (void *)0x0) {
    pcStack_1098 = (code *)0x19c1ee;
    iVar1 = uv_idle_start(&idle_handle,idle_cb);
    pvStack_1088 = (void *)(long)iVar1;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3d7;
    pcStack_1098 = (code *)0x19c211;
    puVar5 = uv_default_loop();
    pcStack_1098 = (code *)0x19c220;
    iVar1 = uv_check_init(puVar5,&check_handle);
    pvStack_1088 = (void *)(long)iVar1;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3e4;
    pcStack_1098 = (code *)0x19c251;
    iVar1 = uv_check_start(&check_handle,check_cb);
    pvStack_1088 = (void *)(long)iVar1;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3f1;
    pcStack_1098 = (code *)0x19c274;
    puVar5 = uv_default_loop();
    pcStack_1098 = (code *)0x19c283;
    iVar1 = uv_timer_init(puVar5,&timer_handle);
    pvStack_1088 = (void *)(long)iVar1;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c3fe;
    pcStack_1098 = (code *)0x19c2bb;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
    pvStack_1088 = (void *)(long)iVar1;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c40b;
    pcStack_1098 = (code *)0x19c2de;
    puVar5 = uv_default_loop();
    pcStack_1098 = (code *)0x19c2e8;
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    pvStack_1088 = (void *)(long)iVar1;
    pvStack_1090 = (void *)0x0;
    if (pvStack_1088 != (void *)0x0) goto LAB_0019c418;
    pvStack_1088 = (void *)(long)idle_cb_called;
    pvStack_1090 = (void *)0x0;
    if ((long)pvStack_1088 < 1) goto LAB_0019c425;
    pvStack_1088 = (void *)0x1;
    pvStack_1090 = (void *)(long)timer_cb_called;
    if (pvStack_1090 != (void *)0x1) goto LAB_0019c432;
    pvStack_1088 = (void *)0x3;
    pvStack_1090 = (void *)(long)close_cb_called;
    if (pvStack_1090 != (void *)0x3) goto LAB_0019c43f;
    pcStack_1098 = (code *)0x19c374;
    puVar3 = uv_default_loop();
    pcStack_1098 = (code *)0x19c388;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    pcStack_1098 = (code *)0x19c392;
    uv_run(puVar3,UV_RUN_DEFAULT);
    pvStack_1088 = (void *)0x0;
    pcStack_1098 = (code *)0x19c3a0;
    puVar5 = uv_default_loop();
    pcStack_1098 = (code *)0x19c3a8;
    iVar1 = uv_loop_close(puVar5);
    pvStack_1090 = (void *)(long)iVar1;
    if (pvStack_1088 == pvStack_1090) {
      pcStack_1098 = (code *)0x19c3c2;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_1098 = (code *)0x19c3d7;
    run_test_idle_starvation_cold_1();
LAB_0019c3d7:
    pcStack_1098 = (code *)0x19c3e4;
    run_test_idle_starvation_cold_2();
LAB_0019c3e4:
    pcStack_1098 = (code *)0x19c3f1;
    run_test_idle_starvation_cold_3();
LAB_0019c3f1:
    pcStack_1098 = (code *)0x19c3fe;
    run_test_idle_starvation_cold_4();
LAB_0019c3fe:
    pcStack_1098 = (code *)0x19c40b;
    run_test_idle_starvation_cold_5();
LAB_0019c40b:
    pcStack_1098 = (code *)0x19c418;
    run_test_idle_starvation_cold_6();
LAB_0019c418:
    pcStack_1098 = (code *)0x19c425;
    run_test_idle_starvation_cold_7();
LAB_0019c425:
    pcStack_1098 = (code *)0x19c432;
    run_test_idle_starvation_cold_8();
LAB_0019c432:
    pcStack_1098 = (code *)0x19c43f;
    run_test_idle_starvation_cold_9();
LAB_0019c43f:
    pcStack_1098 = (code *)0x19c44c;
    run_test_idle_starvation_cold_10();
  }
  puVar7 = (uv_timer_t *)&pvStack_1088;
  pcStack_1098 = idle_cb;
  run_test_idle_starvation_cold_11();
  if (puVar7 == (uv_timer_t *)&idle_handle) {
    pcStack_10a0 = (code *)0x19c46b;
    pcStack_1098._0_4_ = extraout_EAX;
    idle_cb_cold_2();
    return (int)pcStack_1098;
  }
  pcStack_10a0 = check_cb;
  idle_cb_cold_1();
  if (puVar7 == (uv_timer_t *)&check_handle) {
    pcStack_10a8 = (code *)0x19c484;
    pcStack_10a0._0_4_ = extraout_EAX_00;
    check_cb_cold_2();
    return (int)pcStack_10a0;
  }
  pcStack_10a8 = timer_cb;
  check_cb_cold_1();
  if (puVar7 == &timer_handle) {
    puStack_10b0 = (uv_loop_t *)0x19c49d;
    pcStack_10a8._0_4_ = extraout_EAX_01;
    timer_cb_cold_2();
    return (int)pcStack_10a8;
  }
  puStack_10b0 = (uv_loop_t *)run_test_idle_check;
  timer_cb_cold_1();
  puStack_10b0 = puVar3;
  puVar3 = uv_default_loop();
  iVar1 = uv_idle_init(puVar3,&idle_handle);
  lStack_10b8 = (long)iVar1;
  if (lStack_10b8 == 0) {
    iVar1 = uv_idle_start(&idle_handle,idle_stop);
    lStack_10b8 = (long)iVar1;
    if (lStack_10b8 != 0) goto LAB_0019c6c5;
    puVar3 = uv_default_loop();
    iVar1 = uv_check_init(puVar3,&check_handle);
    lStack_10b8 = (long)iVar1;
    if (lStack_10b8 != 0) goto LAB_0019c6d2;
    iVar1 = uv_check_start(&check_handle,check_cb);
    lStack_10b8 = (long)iVar1;
    if (lStack_10b8 != 0) goto LAB_0019c6df;
    lStack_10b8 = 1;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_ONCE);
    if (lStack_10b8 != iVar1) goto LAB_0019c6ec;
    lStack_10b8 = 1;
    if (check_cb_called != 1) goto LAB_0019c6f9;
    lStack_10b8 = (long)close_cb_called;
    if (lStack_10b8 != 0) goto LAB_0019c706;
    uv_close((uv_handle_t *)&idle_handle,close_cb);
    uv_close((uv_handle_t *)&check_handle,close_cb);
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_ONCE);
    lStack_10b8 = (long)iVar1;
    if (lStack_10b8 != 0) goto LAB_0019c713;
    lStack_10b8 = 2;
    if (close_cb_called == 2) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      lStack_10b8 = 0;
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (lStack_10b8 == iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019c72d;
    }
  }
  else {
    run_test_idle_check_cold_1();
LAB_0019c6c5:
    run_test_idle_check_cold_2();
LAB_0019c6d2:
    run_test_idle_check_cold_3();
LAB_0019c6df:
    run_test_idle_check_cold_4();
LAB_0019c6ec:
    run_test_idle_check_cold_5();
LAB_0019c6f9:
    run_test_idle_check_cold_6();
LAB_0019c706:
    run_test_idle_check_cold_7();
LAB_0019c713:
    run_test_idle_check_cold_8();
  }
  run_test_idle_check_cold_9();
LAB_0019c72d:
  plVar8 = &lStack_10b8;
  run_test_idle_check_cold_10();
  if ((*(byte *)(plVar8 + 7) & 4) != 0) {
    *(long *)plVar8[10] = plVar8[9];
    *(long *)(plVar8[9] + 8) = plVar8[10];
    uVar6 = *(uint *)(plVar8 + 7);
    if (((uVar6 & 4) != 0) && (*(uint *)(plVar8 + 7) = uVar6 & 0xfffffffb, (uVar6 & 8) != 0)) {
      *(int *)(plVar8[1] + 8) = *(int *)(plVar8[1] + 8) + -1;
    }
  }
  return 0;
}

Assistant:

TEST_IMPL(homedir) {
  char homedir[PATHMAX];
  size_t len;
  int r;

  /* Test the normal case */
  len = sizeof homedir;
  homedir[0] = '\0';
  ASSERT_OK(strlen(homedir));
  r = uv_os_homedir(homedir, &len);
  ASSERT_OK(r);
  ASSERT_EQ(strlen(homedir), len);
  ASSERT_GT(len, 0);
  ASSERT_EQ(homedir[len], '\0');

#ifdef _WIN32
  if (len == 3 && homedir[1] == ':')
    ASSERT_EQ(homedir[2], '\\');
  else
    ASSERT_NE(homedir[len - 1], '\\');
#else
  if (len == 1)
    ASSERT_EQ(homedir[0], '/');
  else
    ASSERT_NE(homedir[len - 1], '/');
#endif

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_ENOBUFS);
  ASSERT_GT(len, SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_homedir(NULL, &len);
  ASSERT_EQ(r, UV_EINVAL);
  r = uv_os_homedir(homedir, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  len = 0;
  r = uv_os_homedir(homedir, &len);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}